

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall GEO::FileSystem::MemoryNode::is_directory(MemoryNode *this,string *path)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  MemoryNode *pMVar4;
  _Self local_b8;
  _Self local_b0;
  iterator it;
  _Self local_a0;
  _Self local_98 [3];
  string local_80 [8];
  string rest;
  string local_60 [8];
  string subdir;
  string local_40 [8];
  string result;
  string *path_local;
  MemoryNode *this_local;
  
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  split_path(path,(string *)local_60,(string *)local_80);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"");
  if (bVar1) {
    local_98[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
         ::find(&this->subnodes_,(key_type *)local_80);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
         ::end(&this->subnodes_);
    this_local._7_1_ = std::operator!=(local_98,&local_a0);
  }
  else {
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
         ::find(&this->subnodes_,(key_type *)local_60);
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
         ::end(&this->subnodes_);
    bVar1 = std::operator==(&local_b0,&local_b8);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>
               ::operator->(&local_b0);
      pMVar4 = SmartPointer<GEO::FileSystem::MemoryNode>::operator->(&ppVar3->second);
      iVar2 = (*(pMVar4->super_Node).super_Counted._vptr_Counted[3])(pMVar4,local_80);
      this_local._7_1_ = (bool)((byte)iVar2 & 1);
    }
  }
  it._M_node._4_4_ = 1;
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool MemoryNode::is_directory(const std::string& path) {
	    std::string result;
	    std::string subdir;
	    std::string rest;
	    split_path(path, subdir, rest);
	    if(subdir == "") {
		return(subnodes_.find(rest) != subnodes_.end());
	    } else {
		auto it = subnodes_.find(subdir);
		if(it == subnodes_.end()) {
		    return false;
		}
		return it->second->is_directory(rest);
	    }
	}